

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O1

void __thiscall
slang::ast::UnaryExpression::serializeTo(UnaryExpression *this,ASTSerializer *serializer)

{
  size_t __n;
  
  __n = strlen(*(char **)(toString(slang::ast::UnaryOperator)::strings + (long)(int)this->op * 8));
  ASTSerializer::write(serializer,2,"op",__n);
  ASTSerializer::write(serializer,7,"operand",(size_t)this->operand_);
  return;
}

Assistant:

void UnaryExpression::serializeTo(ASTSerializer& serializer) const {
    serializer.write("op", toString(op));
    serializer.write("operand", operand());
}